

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * build_repetition(string *__return_storage_ptr__,string *item_rule,int min_items,
                         int max_items,string *separator_rule)

{
  long lVar1;
  uint uVar2;
  string *psVar3;
  long *plVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  uint uVar6;
  pointer *ppcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  string *psVar9;
  size_type *psVar10;
  int min_items_00;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  uint uVar12;
  pointer pcVar13;
  undefined8 uVar14;
  uint uVar15;
  pointer *local_110;
  long local_108;
  pointer local_100;
  undefined8 uStack_f8;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer *local_90;
  long local_88;
  pointer local_80;
  long lStack_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (max_items == 1 && min_items == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = (item_rule->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar13,pcVar13 + item_rule->_M_string_length);
    psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    return psVar3;
  }
  if (separator_rule->_M_string_length == 0) {
    if (min_items == 1 && (max_items ^ 0x7fffffffU) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = (item_rule->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar13,pcVar13 + item_rule->_M_string_length);
      psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      return psVar3;
    }
    if ((max_items ^ 0x7fffffffU) == 0 && min_items == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar13 = (item_rule->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar13,pcVar13 + item_rule->_M_string_length);
      psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      return psVar3;
    }
    local_d0._M_allocated_capacity = (size_type)local_c0;
    pcVar13 = (item_rule->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar13,pcVar13 + item_rule->_M_string_length);
    std::__cxx11::string::append(local_d0._M_local_buf);
    uVar12 = -min_items;
    if (0 < min_items) {
      uVar12 = min_items;
    }
    uVar15 = 1;
    if (9 < uVar12) {
      uVar11 = (ulong)uVar12;
      uVar2 = 4;
      do {
        uVar15 = uVar2;
        uVar6 = (uint)uVar11;
        if (uVar6 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_001fbbf6;
        }
        if (uVar6 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_001fbbf6;
        }
        if (uVar6 < 10000) goto LAB_001fbbf6;
        uVar11 = uVar11 / 10000;
        uVar2 = uVar15 + 4;
      } while (99999 < uVar6);
      uVar15 = uVar15 + 1;
    }
LAB_001fbbf6:
    local_90 = &local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar15 - (char)(min_items >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)min_items >> 0x1f) + (long)local_90),uVar15,uVar12);
    pcVar13 = (pointer)0xf;
    if ((string *)local_d0._M_allocated_capacity != (string *)local_c0) {
      pcVar13 = (pointer)local_c0._0_8_;
    }
    if (pcVar13 < (pointer)(local_88 + local_d0._8_8_)) {
      pcVar13 = (pointer)0xf;
      if (local_90 != &local_80) {
        pcVar13 = local_80;
      }
      if (pcVar13 < (pointer)(local_88 + local_d0._8_8_)) goto LAB_001fbc7f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,local_d0._M_allocated_capacity);
    }
    else {
LAB_001fbc7f:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_d0._M_local_buf,(ulong)local_90);
    }
    local_c0._16_8_ = &local_a0;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 == paVar8) {
      local_a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_a0._8_8_ = puVar5[3];
    }
    else {
      local_a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_c0._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
    }
    local_c0._24_8_ = puVar5[1];
    *puVar5 = paVar8;
    puVar5[1] = 0;
    paVar8->_M_local_buf[0] = '\0';
    plVar4 = (long *)std::__cxx11::string::append(local_c0 + 0x10);
    psVar3 = (string *)(local_f0 + 0x10);
    psVar9 = (string *)(plVar4 + 2);
    if ((string *)*plVar4 == psVar9) {
      local_f0._16_8_ = (psVar9->_M_dataplus)._M_p;
      local_f0._24_4_ = (undefined4)plVar4[3];
      local_f0._28_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
      local_f0._0_8_ = psVar3;
    }
    else {
      local_f0._16_8_ = (psVar9->_M_dataplus)._M_p;
      local_f0._0_8_ = (string *)*plVar4;
    }
    local_f0._8_8_ = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (max_items == 0x7fffffff) {
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    }
    else {
      uVar12 = -max_items;
      if (0 < max_items) {
        uVar12 = max_items;
      }
      uVar15 = 1;
      if (9 < uVar12) {
        uVar11 = (ulong)uVar12;
        uVar2 = 4;
        do {
          uVar15 = uVar2;
          uVar6 = (uint)uVar11;
          if (uVar6 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_001fbdc7;
          }
          if (uVar6 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_001fbdc7;
          }
          if (uVar6 < 10000) goto LAB_001fbdc7;
          uVar11 = uVar11 / 10000;
          uVar2 = uVar15 + 4;
        } while (99999 < uVar6);
        uVar15 = uVar15 + 1;
      }
LAB_001fbdc7:
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar15 - (char)(max_items >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_70._0_8_ + (ulong)((uint)max_items >> 0x1f)),uVar15,uVar12);
    }
    pcVar13 = (pointer)0xf;
    if ((string *)local_f0._0_8_ != psVar3) {
      pcVar13 = (pointer)local_f0._16_8_;
    }
    if (pcVar13 < (pointer)(local_70._8_8_ + local_f0._8_8_)) {
      pcVar13 = (pointer)0xf;
      if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
        pcVar13 = (pointer)local_70._16_8_;
      }
      if (pcVar13 < (pointer)(local_70._8_8_ + local_f0._8_8_)) goto LAB_001fbe53;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,local_f0._0_8_);
    }
    else {
LAB_001fbe53:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_f0,local_70._0_8_);
    }
    local_110 = &local_100;
    ppcVar7 = (pointer *)(puVar5 + 2);
    if ((pointer *)*puVar5 == ppcVar7) {
      local_100 = *ppcVar7;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *ppcVar7;
      local_110 = (pointer *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = ppcVar7;
    puVar5[1] = 0;
    *(undefined1 *)ppcVar7 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar10 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar10) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110,(ulong)(local_100 + 1));
    }
    if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
    }
    if ((string *)local_f0._0_8_ != psVar3) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._16_8_ != &local_a0) {
      operator_delete((void *)local_c0._16_8_,local_a0._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,(ulong)(local_80 + 1));
    }
    pcVar13 = (pointer)local_c0._0_8_;
    uVar14 = local_d0._M_allocated_capacity;
    if ((string *)local_d0._M_allocated_capacity == (string *)local_c0) {
      return (string *)local_c0;
    }
    goto LAB_001fbfa6;
  }
  local_110 = &local_100;
  pcVar13 = (item_rule->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar13,pcVar13 + item_rule->_M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,"(",
                 separator_rule);
  plVar4 = (long *)std::__cxx11::string::append(local_70);
  local_90 = &local_80;
  ppcVar7 = (pointer *)(plVar4 + 2);
  if ((pointer *)*plVar4 == ppcVar7) {
    local_80 = *ppcVar7;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *ppcVar7;
    local_90 = (pointer *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)ppcVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(item_rule->_M_dataplus)._M_p);
  local_d0._M_allocated_capacity = (size_type)local_c0;
  psVar3 = (string *)(plVar4 + 2);
  if ((string *)*plVar4 == psVar3) {
    local_c0._0_8_ = (psVar3->_M_dataplus)._M_p;
    local_c0._8_8_ = plVar4[3];
  }
  else {
    local_c0._0_8_ = (psVar3->_M_dataplus)._M_p;
    local_d0._M_allocated_capacity = (size_type)(string *)*plVar4;
  }
  local_d0._8_8_ = plVar4[1];
  *plVar4 = (long)psVar3;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append(local_d0._M_local_buf);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 == paVar8) {
    local_a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_a0._8_8_ = puVar5[3];
    local_c0._16_8_ = &local_a0;
  }
  else {
    local_a0._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_c0._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar5;
  }
  local_c0._24_8_ = puVar5[1];
  *puVar5 = paVar8;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_50._M_allocated_capacity = (size_type)&local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  min_items_00 = min_items + -1;
  if (min_items == 0) {
    min_items_00 = 0;
  }
  build_repetition((string *)local_f0,(string *)(local_c0 + 0x10),min_items_00,
                   max_items - (uint)(max_items != 0x7fffffff),(string *)&local_50);
  pcVar13 = (pointer)0xf;
  if (local_110 != &local_100) {
    pcVar13 = local_100;
  }
  if (pcVar13 < (pointer)(local_f0._8_8_ + local_108)) {
    pcVar13 = (pointer)0xf;
    if ((string *)local_f0._0_8_ != (string *)(local_f0 + 0x10)) {
      pcVar13 = (pointer)local_f0._16_8_;
    }
    if (pcVar13 < (pointer)(local_f0._8_8_ + local_108)) goto LAB_001fb9b9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001fb9b9:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,local_f0._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar10) {
    uVar14 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar14;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar10;
  puVar5[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((string *)local_f0._0_8_ != (string *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._16_8_ != &local_a0) {
    operator_delete((void *)local_c0._16_8_,local_a0._M_allocated_capacity + 1);
  }
  if ((string *)local_d0._M_allocated_capacity != (string *)local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,(ulong)(local_c0._0_8_ + 1));
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,(ulong)(local_80 + 1));
  }
  psVar3 = (string *)(local_70 + 0x10);
  if ((string *)local_70._0_8_ != psVar3) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
    psVar3 = extraout_RAX;
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,(ulong)(local_100 + 1));
    psVar3 = extraout_RAX_00;
  }
  if (min_items != 0) {
    return psVar3;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,"(",
                 __return_storage_ptr__);
  puVar5 = (undefined8 *)std::__cxx11::string::append(local_f0);
  ppcVar7 = (pointer *)(puVar5 + 2);
  if ((pointer *)*puVar5 == ppcVar7) {
    local_100 = *ppcVar7;
    uStack_f8 = puVar5[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *ppcVar7;
    local_110 = (pointer *)*puVar5;
  }
  local_108 = puVar5[1];
  *puVar5 = ppcVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  psVar3 = (string *)
           std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
  if (local_110 != &local_100) {
    operator_delete(local_110,(ulong)(local_100 + 1));
    psVar3 = extraout_RAX_01;
  }
  pcVar13 = (pointer)local_f0._16_8_;
  uVar14 = local_f0._0_8_;
  if ((string *)local_f0._0_8_ == (string *)(local_f0 + 0x10)) {
    return psVar3;
  }
LAB_001fbfa6:
  operator_delete((void *)uVar14,(ulong)(pcVar13 + 1));
  return extraout_RAX_02;
}

Assistant:

static std::string build_repetition(const std::string & item_rule, int min_items, int max_items, const std::string & separator_rule = "") {
    auto has_max = max_items != std::numeric_limits<int>::max();

    if (min_items == 0 && max_items == 1) {
        return item_rule + "?";
    }

    if (separator_rule.empty()) {
        if (min_items == 1 && !has_max) {
            return item_rule + "+";
        } else if (min_items == 0 && !has_max) {
            return item_rule + "*";
        } else {
            return item_rule + "{" + std::to_string(min_items) + "," + (has_max ? std::to_string(max_items) : "") + "}";
        }
    }

    auto result = item_rule + " " + build_repetition("(" + separator_rule + " " + item_rule + ")", min_items == 0 ? 0 : min_items - 1, has_max ? max_items - 1 : max_items);
    if (min_items == 0) {
        result = "(" + result + ")?";
    }
    return result;
}